

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O3

void absl::anon_unknown_2::WritePadding(ostream *o,size_t pad)

{
  _func_int *p_Var1;
  code cVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  char fill_buf [32];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  p_Var1 = (_func_int *)((long)&o->_vptr_basic_ostream + (long)o->_vptr_basic_ostream[-3]);
  if ((&o->field_0xe1)[(long)o->_vptr_basic_ostream[-3]] == '\x01') {
    cVar2 = p_Var1[0xe0];
  }
  else {
    cVar2 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = cVar2;
    p_Var1[0xe1] = (code)0x1;
  }
  auVar4 = pshuflw(ZEXT216(CONCAT11(cVar2,cVar2)),ZEXT216(CONCAT11(cVar2,cVar2)),0);
  local_48 = auVar4._0_4_;
  uStack_44 = local_48;
  uStack_40 = local_48;
  uStack_3c = local_48;
  local_38 = local_48;
  uStack_34 = local_48;
  uStack_30 = local_48;
  uStack_2c = local_48;
  if (pad != 0) {
    do {
      uVar3 = 0x20;
      if (pad < 0x20) {
        uVar3 = pad;
      }
      std::ostream::write((char *)o,(long)&local_48);
      pad = pad - uVar3;
    } while (pad != 0);
  }
  return;
}

Assistant:

void WritePadding(std::ostream& o, size_t pad) {
  char fill_buf[32];
  memset(fill_buf, o.fill(), sizeof(fill_buf));
  while (pad) {
    size_t n = std::min(pad, sizeof(fill_buf));
    o.write(fill_buf, n);
    pad -= n;
  }
}